

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_outpoint.cpp
# Opt level: O2

void __thiscall OutPoint_Operators_Test::TestBody(OutPoint_Operators_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper local_160;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  string local_150;
  AssertionResult gtest_ar_;
  OutPoint outpoint1;
  OutPoint outpoint2;
  OutPoint outpoint4;
  OutPoint outpoint3;
  Txid txid;
  ByteData256 byte_data2;
  ByteData256 byte_data;
  Txid txid2;
  
  std::__cxx11::string::string
            ((string *)&outpoint1,"3412907856341290785634129078563412907856341290785634129078563412"
             ,(allocator *)&outpoint2);
  cfd::core::ByteData256::ByteData256(&byte_data,(string *)&outpoint1);
  std::__cxx11::string::~string((string *)&outpoint1);
  cfd::core::Txid::Txid(&txid,&byte_data);
  std::__cxx11::string::string
            ((string *)&outpoint1,"9812907856341290785634129078563412907856341290785634129078563412"
             ,(allocator *)&outpoint2);
  cfd::core::ByteData256::ByteData256(&byte_data2,(string *)&outpoint1);
  std::__cxx11::string::~string((string *)&outpoint1);
  cfd::core::Txid::Txid(&txid2,&byte_data2);
  cfd::core::OutPoint::OutPoint(&outpoint1,&txid,1);
  cfd::core::OutPoint::OutPoint(&outpoint2,&txid,1);
  cfd::core::OutPoint::OutPoint(&outpoint3,&txid,2);
  cfd::core::OutPoint::OutPoint(&outpoint4,&txid2,1);
  gtest_ar_.success_ = cfd::core::operator>=(&outpoint1,&outpoint2);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)&gtest_ar_,(AssertionResult *)"(outpoint1 >= outpoint2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x4f,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::operator>=(&outpoint1,&outpoint3);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)&gtest_ar_,(AssertionResult *)"(outpoint1 >= outpoint3)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x50,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = cfd::core::operator>=(&outpoint1,&outpoint4);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)&gtest_ar_,(AssertionResult *)"(outpoint1 >= outpoint4)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x51,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::operator>(&outpoint1,&outpoint2);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)&gtest_ar_,(AssertionResult *)"(outpoint1 > outpoint2)","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x53,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::operator>(&outpoint1,&outpoint3);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)&gtest_ar_,(AssertionResult *)"(outpoint1 > outpoint3)","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x54,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = cfd::core::operator>(&outpoint1,&outpoint4);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)&gtest_ar_,(AssertionResult *)"(outpoint1 > outpoint4)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x55,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = cfd::core::operator<=(&outpoint1,&outpoint2);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)&gtest_ar_,(AssertionResult *)"(outpoint1 <= outpoint2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x57,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = cfd::core::operator<=(&outpoint1,&outpoint3);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)&gtest_ar_,(AssertionResult *)"(outpoint1 <= outpoint3)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x58,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::operator<=(&outpoint1,&outpoint4);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)&gtest_ar_,(AssertionResult *)"(outpoint1 <= outpoint4)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x59,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::operator<(&outpoint1,&outpoint2);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)&gtest_ar_,(AssertionResult *)"(outpoint1 < outpoint2)","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x5b,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = cfd::core::operator<(&outpoint1,&outpoint3);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)&gtest_ar_,(AssertionResult *)"(outpoint1 < outpoint3)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x5c,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::operator<(&outpoint1,&outpoint4);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)&gtest_ar_,(AssertionResult *)"(outpoint1 < outpoint4)","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x5d,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = cfd::core::operator<(&outpoint4,&outpoint3);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)&gtest_ar_,(AssertionResult *)"(outpoint4 < outpoint3)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x5f,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::Txid::~Txid(&outpoint4.txid_);
  cfd::core::Txid::~Txid(&outpoint3.txid_);
  cfd::core::Txid::~Txid(&outpoint2.txid_);
  cfd::core::Txid::~Txid(&outpoint1.txid_);
  cfd::core::Txid::~Txid(&txid2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data2);
  cfd::core::Txid::~Txid(&txid);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  return;
}

Assistant:

TEST(OutPoint, Operators) {
  ByteData256 byte_data = ByteData256(
      "3412907856341290785634129078563412907856341290785634129078563412");
  Txid txid = Txid(byte_data);
  ByteData256 byte_data2 = ByteData256(
      "9812907856341290785634129078563412907856341290785634129078563412");
  Txid txid2 = Txid(byte_data2);
  OutPoint outpoint1(txid, 1);
  OutPoint outpoint2(txid, 1);
  OutPoint outpoint3(txid, 2);
  OutPoint outpoint4(txid2, 1);

  EXPECT_TRUE((outpoint1 >= outpoint2));
  EXPECT_FALSE((outpoint1 >= outpoint3));
  EXPECT_TRUE((outpoint1 >= outpoint4));

  EXPECT_FALSE((outpoint1 > outpoint2));
  EXPECT_FALSE((outpoint1 > outpoint3));
  EXPECT_TRUE((outpoint1 > outpoint4));

  EXPECT_TRUE((outpoint1 <= outpoint2));
  EXPECT_TRUE((outpoint1 <= outpoint3));
  EXPECT_FALSE((outpoint1 <= outpoint4));

  EXPECT_FALSE((outpoint1 < outpoint2));
  EXPECT_TRUE((outpoint1 < outpoint3));
  EXPECT_FALSE((outpoint1 < outpoint4));

  EXPECT_TRUE((outpoint4 < outpoint3));
}